

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O0

int * Wln_RetHeadToTail(Wln_Ret_t *p,int *pHead)

{
  int *pHead_00;
  int *pLink;
  int *pHead_local;
  Wln_Ret_t *p_local;
  
  if (*pHead == 0) {
    __assert_fail("pHead[0]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                  ,0x15e,"int *Wln_RetHeadToTail(Wln_Ret_t *, int *)");
  }
  pHead_00 = Vec_IntEntryP(&p->vEdgeLinks,*pHead);
  p_local = (Wln_Ret_t *)pHead;
  if (*pHead_00 != 0) {
    p_local = (Wln_Ret_t *)Wln_RetHeadToTail(p,pHead_00);
  }
  return (int *)p_local;
}

Assistant:

int * Wln_RetHeadToTail( Wln_Ret_t * p, int * pHead )
{
    int * pLink;
    assert( pHead[0] );
    pLink = Vec_IntEntryP( &p->vEdgeLinks, pHead[0] );
    if ( pLink[0] == 0 )
        return pHead;
    return Wln_RetHeadToTail( p, pLink );
}